

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeParameterIndex(Vdbe *p,char *zName,int nName)

{
  short sVar1;
  char **ppcVar2;
  char *__s1;
  int iVar3;
  long lVar4;
  bool bVar5;
  int local_3c;
  
  if ((zName != (char *)0x0 && p != (Vdbe *)0x0) && (sVar1 = p->nzVar, 0 < (long)sVar1)) {
    ppcVar2 = p->azVar;
    lVar4 = 0;
    do {
      __s1 = ppcVar2[lVar4];
      bVar5 = true;
      if ((__s1 != (char *)0x0) && (iVar3 = strncmp(__s1,zName,(long)nName), iVar3 == 0)) {
        bVar5 = __s1[nName] != '\0';
        if (!bVar5) {
          local_3c = (int)lVar4 + 1;
        }
      }
      if (!bVar5) {
        return local_3c;
      }
      lVar4 = lVar4 + 1;
    } while (sVar1 != lVar4);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeParameterIndex(Vdbe *p, const char *zName, int nName){
  int i;
  if( p==0 ){
    return 0;
  }
  if( zName ){
    for(i=0; i<p->nzVar; i++){
      const char *z = p->azVar[i];
      if( z && strncmp(z,zName,nName)==0 && z[nName]==0 ){
        return i+1;
      }
    }
  }
  return 0;
}